

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

sg_image sg_make_image(sg_image_desc *desc)

{
  sg_image img_id_00;
  _sg_image_t *img_00;
  _sg_image_t *img;
  sg_image_desc desc_def;
  sg_image_desc *desc_local;
  sg_image img_id;
  
  desc_def._1680_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f15,"sg_image sg_make_image(const sg_image_desc *)");
  }
  if (desc == (sg_image_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f16,"sg_image sg_make_image(const sg_image_desc *)");
  }
  _sg_image_desc_defaults((sg_image_desc *)&img,desc);
  img_id_00 = _sg_alloc_image();
  if (img_id_00.id == 0) {
    _sg_log("image pool exhausted!");
  }
  else {
    img_00 = _sg_image_at(&_sg.pools,img_id_00.id);
    if ((img_00 == (_sg_image_t *)0x0) || ((img_00->slot).state != SG_RESOURCESTATE_ALLOC)) {
      __assert_fail("img && (img->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f1b,"sg_image sg_make_image(const sg_image_desc *)");
    }
    _sg_init_image(img_00,(sg_image_desc *)&img);
    if (((img_00->slot).state != SG_RESOURCESTATE_VALID) &&
       ((img_00->slot).state != SG_RESOURCESTATE_FAILED)) {
      __assert_fail("(img->slot.state == SG_RESOURCESTATE_VALID) || (img->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f1d,"sg_image sg_make_image(const sg_image_desc *)");
    }
  }
  return (sg_image)img_id_00.id;
}

Assistant:

inline sg_image sg_make_image(const sg_image_desc& desc) { return sg_make_image(&desc); }